

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS
ref_mpi_blindsend(REF_MPI ref_mpi,REF_INT *proc,void *send,REF_INT ldim,REF_INT nsend,void **recv,
                 REF_INT *nrecv,REF_TYPE type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  REF_INT *send_size;
  REF_INT *recv_size;
  long lVar4;
  int *__ptr;
  void *pvVar5;
  ulong uVar6;
  undefined8 uVar7;
  int iVar8;
  REF_STATUS RVar9;
  char *pcVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  void *local_70;
  
  *recv = (void *)0x0;
  if (1 < (long)ref_mpi->n) {
    sVar11 = (long)ref_mpi->n << 2;
    send_size = (REF_INT *)malloc(sVar11);
    if (send_size == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x450,
             "ref_mpi_blindsend","malloc a_size of REF_INT NULL");
      return 2;
    }
    memset(send_size,0,sVar11);
    iVar2 = ref_mpi->n;
    if ((long)iVar2 < 0) {
      bVar1 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x451,
             "ref_mpi_blindsend","malloc b_size of REF_INT negative");
      RVar9 = 1;
      recv_size = send_size;
    }
    else {
      sVar11 = (long)iVar2 * 4;
      recv_size = (REF_INT *)malloc(sVar11);
      if (recv_size == (REF_INT *)0x0) {
        recv_size = (REF_INT *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x451
               ,"ref_mpi_blindsend","malloc b_size of REF_INT NULL");
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if (iVar2 != 0) {
          memset(recv_size,0,sVar11);
        }
      }
      RVar9 = 2;
    }
    if (!bVar1) {
      return RVar9;
    }
    if (0 < nsend) {
      uVar6 = 0;
      do {
        send_size[proc[uVar6]] = send_size[proc[uVar6]] + 1;
        uVar6 = uVar6 + 1;
      } while ((uint)nsend != uVar6);
    }
    *recv_size = *send_size;
    iVar2 = ref_mpi->n;
    lVar13 = (long)iVar2;
    iVar8 = 0;
    iVar12 = 0;
    if (0 < lVar13) {
      lVar4 = 0;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + send_size[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar13 != lVar4);
    }
    if (0 < iVar2) {
      lVar4 = 0;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + recv_size[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar13 != lVar4);
    }
    if (iVar2 < 0) {
      pcVar10 = "malloc a_next of REF_INT negative";
      uVar7 = 0x45e;
    }
    else {
      __ptr = (int *)malloc(lVar13 * 4);
      if (__ptr == (int *)0x0) {
        pcVar10 = "malloc a_next of REF_INT NULL";
        uVar7 = 0x45e;
LAB_0022151f:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7
               ,"ref_mpi_blindsend",pcVar10);
        return 2;
      }
      *__ptr = 0;
      if (1 < iVar2) {
        iVar2 = *__ptr;
        lVar4 = 0;
        do {
          iVar2 = iVar2 + send_size[lVar4];
          __ptr[lVar4 + 1] = iVar2;
          lVar4 = lVar4 + 1;
        } while (lVar13 + -1 != lVar4);
      }
      *recv = (void *)0x0;
      if (type == 3) {
        if (iVar12 * ldim < 0) {
          pcVar10 = "malloc a_data of REF_DBL negative";
          uVar7 = 0x47b;
        }
        else {
          local_70 = malloc((ulong)(uint)(iVar12 * ldim) << 3);
          if (local_70 == (void *)0x0) {
            pcVar10 = "malloc a_data of REF_DBL NULL";
            uVar7 = 0x47b;
            goto LAB_0022151f;
          }
          if (-1 < iVar8 * ldim) {
            pvVar5 = malloc((ulong)(uint)(iVar8 * ldim) << 3);
            *recv = pvVar5;
            if (pvVar5 == (void *)0x0) {
              pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL NULL";
              uVar7 = 0x47c;
LAB_00221992:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                     ,uVar7,"ref_mpi_blindsend",pcVar10);
              return 2;
            }
            if (0 < nsend) {
              uVar3 = 0;
              uVar6 = 0;
              do {
                if (0 < ldim) {
                  memcpy((void *)((long)local_70 + (long)__ptr[proc[uVar6]] * (long)ldim * 8),
                         (void *)((long)send + (ulong)uVar3 * 8),(ulong)(uint)ldim << 3);
                }
                __ptr[proc[uVar6]] = __ptr[proc[uVar6]] + 1;
                uVar6 = uVar6 + 1;
                uVar3 = uVar3 + ldim;
              } while ((uint)nsend != uVar6);
            }
LAB_00221820:
            uVar3 = ref_mpi_alltoallv(ref_mpi,local_70,send_size,*recv,recv_size,ldim,type);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                     ,0x489,"ref_mpi_blindsend",(ulong)uVar3,"alltoallv global");
              return uVar3;
            }
            *nrecv = iVar8;
            free(__ptr);
            free(local_70);
            free(recv_size);
            free(send_size);
            return 0;
          }
          pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL negative";
          uVar7 = 0x47c;
        }
      }
      else if (type == 2) {
        if (iVar12 * ldim < 0) {
          pcVar10 = "malloc a_data of REF_LONG negative";
          uVar7 = 0x471;
        }
        else {
          local_70 = malloc((ulong)(uint)(iVar12 * ldim) << 3);
          if (local_70 == (void *)0x0) {
            pcVar10 = "malloc a_data of REF_LONG NULL";
            uVar7 = 0x471;
            goto LAB_0022151f;
          }
          if (-1 < iVar8 * ldim) {
            pvVar5 = malloc((ulong)(uint)(iVar8 * ldim) << 3);
            *recv = pvVar5;
            if (pvVar5 == (void *)0x0) {
              pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG NULL";
              uVar7 = 0x472;
              goto LAB_00221992;
            }
            if (0 < nsend) {
              uVar3 = 0;
              uVar6 = 0;
              do {
                if (0 < ldim) {
                  memcpy((void *)((long)local_70 + (long)__ptr[proc[uVar6]] * (long)ldim * 8),
                         (void *)((long)send + (ulong)uVar3 * 8),(ulong)(uint)ldim << 3);
                }
                __ptr[proc[uVar6]] = __ptr[proc[uVar6]] + 1;
                uVar6 = uVar6 + 1;
                uVar3 = uVar3 + ldim;
              } while ((uint)nsend != uVar6);
            }
            goto LAB_00221820;
          }
          pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG negative";
          uVar7 = 0x472;
        }
      }
      else {
        if (type != 1) {
          uVar7 = 0x485;
          goto LAB_002211d3;
        }
        if (iVar12 * ldim < 0) {
          pcVar10 = "malloc a_data of REF_INT negative";
          uVar7 = 0x467;
        }
        else {
          local_70 = malloc((ulong)(uint)(iVar12 * ldim) << 2);
          if (local_70 == (void *)0x0) {
            pcVar10 = "malloc a_data of REF_INT NULL";
            uVar7 = 0x467;
            goto LAB_0022151f;
          }
          if (-1 < iVar8 * ldim) {
            pvVar5 = malloc((ulong)(uint)(iVar8 * ldim) << 2);
            *recv = pvVar5;
            if (pvVar5 == (void *)0x0) {
              pcVar10 = "malloc *((REF_INT **)recv) of REF_INT NULL";
              uVar7 = 0x468;
              goto LAB_00221992;
            }
            if (0 < nsend) {
              uVar6 = 0;
              uVar14 = 0;
              do {
                if (0 < ldim) {
                  memcpy((void *)((long)local_70 + (long)__ptr[proc[uVar14]] * (long)ldim * 4),
                         (void *)((long)send + uVar6 * 4),(ulong)(uint)ldim << 2);
                }
                __ptr[proc[uVar14]] = __ptr[proc[uVar14]] + 1;
                uVar14 = uVar14 + 1;
                uVar6 = (ulong)(uint)((int)uVar6 + ldim);
              } while ((uint)nsend != uVar14);
            }
            goto LAB_00221820;
          }
          pcVar10 = "malloc *((REF_INT **)recv) of REF_INT negative";
          uVar7 = 0x468;
        }
      }
    }
LAB_002214a9:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
           "ref_mpi_blindsend",pcVar10);
    return 1;
  }
  *nrecv = nsend;
  if (type == 3) {
    if (nsend * ldim < 0) {
      pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL negative";
      uVar7 = 0x445;
      goto LAB_002214a9;
    }
    uVar6 = (ulong)(uint)(nsend * ldim);
    pvVar5 = malloc(uVar6 * 8);
    *recv = pvVar5;
    if (pvVar5 == (void *)0x0) {
      pcVar10 = "malloc *((REF_DBL **)recv) of REF_DBL NULL";
      uVar7 = 0x445;
      goto LAB_0022151f;
    }
  }
  else {
    if (type != 2) {
      if (type != 1) {
        uVar7 = 1099;
LAB_002211d3:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7
               ,"ref_mpi_blindsend",6,"data type");
        return 6;
      }
      uVar3 = nsend * ldim;
      if ((int)uVar3 < 0) {
        pcVar10 = "malloc *((REF_INT **)recv) of REF_INT negative";
        uVar7 = 0x439;
        goto LAB_002214a9;
      }
      pvVar5 = malloc((ulong)uVar3 * 4);
      *recv = pvVar5;
      if (pvVar5 == (void *)0x0) {
        pcVar10 = "malloc *((REF_INT **)recv) of REF_INT NULL";
        uVar7 = 0x439;
        goto LAB_0022151f;
      }
      if (uVar3 == 0) {
        return 0;
      }
      sVar11 = (ulong)uVar3 << 2;
      goto LAB_00221199;
    }
    if (nsend * ldim < 0) {
      pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG negative";
      uVar7 = 0x43f;
      goto LAB_002214a9;
    }
    uVar6 = (ulong)(uint)(nsend * ldim);
    pvVar5 = malloc(uVar6 * 8);
    *recv = pvVar5;
    if (pvVar5 == (void *)0x0) {
      pcVar10 = "malloc *((REF_LONG **)recv) of REF_LONG NULL";
      uVar7 = 0x43f;
      goto LAB_0022151f;
    }
  }
  if (nsend * ldim == 0) {
    return 0;
  }
  sVar11 = uVar6 << 3;
LAB_00221199:
  memcpy(pvVar5,send,sVar11);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_blindsend(REF_MPI ref_mpi, REF_INT *proc, void *send,
                                     REF_INT ldim, REF_INT nsend, void **recv,
                                     REF_INT *nrecv, REF_TYPE type) {
  REF_INT i, l, part;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_INT a_total, b_total;

  void *a_data;

  a_data = NULL;
  *recv = NULL;

  if (!ref_mpi_para(ref_mpi)) {
    *nrecv = nsend;
    switch (type) {
      case REF_INT_TYPE:
        ref_malloc(*((REF_INT **)recv), ldim * nsend, REF_INT);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_INT **)recv))[i] = ((REF_INT *)send)[i];
        }
        break;
      case REF_LONG_TYPE:
        ref_malloc(*((REF_LONG **)recv), ldim * nsend, REF_LONG);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_LONG **)recv))[i] = ((REF_LONG *)send)[i];
        }
        break;
      case REF_DBL_TYPE:
        ref_malloc(*((REF_DBL **)recv), ldim * nsend, REF_DBL);
        for (i = 0; i < ldim * nsend; i++) {
          (*((REF_DBL **)recv))[i] = ((REF_DBL *)send)[i];
        }
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (i = 0; i < nsend; i++) a_size[proc[i]]++;

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  a_data = NULL;
  *recv = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_INT);
      ref_malloc(*((REF_INT **)recv), ldim * b_total, REF_INT);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_INT *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_INT *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_LONG_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_LONG);
      ref_malloc(*((REF_LONG **)recv), ldim * b_total, REF_LONG);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_LONG *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_LONG *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    case REF_DBL_TYPE:
      ref_malloc(a_data, ldim * a_total, REF_DBL);
      ref_malloc(*((REF_DBL **)recv), ldim * b_total, REF_DBL);
      for (i = 0; i < nsend; i++) {
        for (l = 0; l < ldim; l++)
          ((REF_DBL *)a_data)[l + ldim * a_next[proc[i]]] =
              ((REF_DBL *)send)[l + ldim * i];
        a_next[proc[i]]++;
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_data, a_size, *recv, b_size, ldim, type),
      "alltoallv global");

  *nrecv = b_total;

  ref_free(a_next);
  ref_free(a_data);
  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}